

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,int element)

{
  type tVar1;
  int local_18;
  int local_14;
  FlatBufferBuilderImpl<false> *pFStack_10;
  int element_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_14 = element;
  pFStack_10 = this;
  AssertScalarT<int>(this);
  Align(this,4);
  local_18 = EndianScalar<int>(local_14);
  vector_downward<unsigned_int>::push_small<int>(&this->buf_,&local_18);
  tVar1 = CalculateOffset<unsigned_int>(this);
  return tVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }